

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O3

void cp_expr_sizeof(CPState *cp,CPValue *k,int wantsz)

{
  int iVar1;
  CTypeID CVar2;
  CTInfo CVar3;
  CTSize sz;
  CTSize local_1c;
  
  if (cp->tok == 0x28) {
    cp_next(cp);
    iVar1 = cp->tok;
    if (((iVar1 - 0x10dU < 0x1d) || (iVar1 == 0x24)) ||
       ((iVar1 == 0x100 && ((cp->ct->info & 0xf0000000) == 0x70000000)))) {
      CVar2 = cp_decl_abstract(cp);
      k->id = CVar2;
    }
    else {
      cp_expr_comma(cp,k);
    }
    cp_check(cp,0x29);
  }
  else {
    cp_expr_unary(cp,k);
  }
  CVar3 = lj_ctype_info(cp->cts,k->id,&local_1c);
  if (wantsz == 0) {
    local_1c = 1 << ((byte)(CVar3 >> 0x10) & 0xf);
  }
  else if (local_1c == 0xffffffff) {
    if (k->id != 0x15) {
      cp_err(cp,LJ_ERR_FFI_INVSIZE);
    }
    goto LAB_00151a5e;
  }
  (k->field_0).i32 = local_1c;
LAB_00151a5e:
  k->id = 10;
  return;
}

Assistant:

static void cp_expr_sizeof(CPState *cp, CPValue *k, int wantsz)
{
  CTSize sz;
  CTInfo info;
  if (cp_opt(cp, '(')) {
    if (cp_istypedecl(cp))
      k->id = cp_decl_abstract(cp);
    else
      cp_expr_comma(cp, k);
    cp_check(cp, ')');
  } else {
    cp_expr_unary(cp, k);
  }
  info = lj_ctype_info(cp->cts, k->id, &sz);
  if (wantsz) {
    if (sz != CTSIZE_INVALID)
      k->u32 = sz;
    else if (k->id != CTID_A_CCHAR)  /* Special case for sizeof("string"). */
      cp_err(cp, LJ_ERR_FFI_INVSIZE);
  } else {
    k->u32 = 1u << ctype_align(info);
  }
  k->id = CTID_UINT32;  /* Really size_t. */
}